

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool __thiscall ImGuiTextFilter::Draw(ImGuiTextFilter *this,char *label,float width)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  
  pIVar1 = GImGui;
  if ((width != 0.0) || (NAN(width))) {
    (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
    (pIVar1->NextItemData).Width = width;
  }
  bVar2 = ImGui::InputText(label,this->InputBuf,0x100,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
  if (bVar2) {
    Build(this);
  }
  return bVar2;
}

Assistant:

bool ImGuiTextFilter::Draw(const char* label, float width)
{
    if (width != 0.0f)
        ImGui::SetNextItemWidth(width);
    bool value_changed = ImGui::InputText(label, InputBuf, IM_ARRAYSIZE(InputBuf));
    if (value_changed)
        Build();
    return value_changed;
}